

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O0

void Hacl_Hash_MD5_reset(Hacl_Streaming_MD_state_32 *state)

{
  uint32_t *s;
  uint8_t *puVar1;
  Hacl_Streaming_MD_state_32 tmp;
  uint32_t *block_state;
  uint8_t *buf;
  Hacl_Streaming_MD_state_32 scrut;
  Hacl_Streaming_MD_state_32 *state_local;
  
  s = state->block_state;
  puVar1 = state->buf;
  Hacl_Hash_MD5_init(s);
  state->block_state = s;
  state->buf = puVar1;
  state->total_len = 0;
  return;
}

Assistant:

void Hacl_Hash_MD5_reset(Hacl_Streaming_MD_state_32 *state)
{
  Hacl_Streaming_MD_state_32 scrut = *state;
  uint8_t *buf = scrut.buf;
  uint32_t *block_state = scrut.block_state;
  Hacl_Hash_MD5_init(block_state);
  Hacl_Streaming_MD_state_32
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U };
  state[0U] = tmp;
}